

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSha1.c
# Opt level: O0

void deSha1_render(deSha1 *hash,char *buffer)

{
  byte bVar1;
  deUint8 val8;
  ulong uStack_20;
  deUint32 val32;
  size_t charNdx;
  char *buffer_local;
  deSha1 *hash_local;
  
  for (uStack_20 = 0; uStack_20 < 0x28; uStack_20 = uStack_20 + 1) {
    bVar1 = (byte)(hash->hash[uStack_20 >> 3] >> (('\a' - ((byte)uStack_20 & 7)) * '\x04' & 0x1f)) &
            0xf;
    if (bVar1 < 10) {
      buffer[uStack_20] = bVar1 + 0x30;
    }
    else {
      buffer[uStack_20] = bVar1 + 0x57;
    }
  }
  return;
}

Assistant:

void deSha1_render (const deSha1* hash, char* buffer)
{
	size_t charNdx;

	for (charNdx = 0; charNdx < 40; charNdx++)
	{
		const deUint32	val32	= hash->hash[charNdx / 8];
		const deUint8	val8	= (deUint8)(0x0fu & (val32 >> (4 * (8 - 1 - (charNdx % 8)))));

		if (val8 < 10)
			buffer[charNdx] = (char)('0' + val8);
		else
			buffer[charNdx] = (char)('a' + val8 - 10);
	}
}